

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

string_t * __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::lexer::get_string(string_t *__return_storage_ptr__,lexer *this)

{
  uchar *puVar1;
  uchar *puVar2;
  char *pcVar3;
  ulong uVar4;
  invalid_argument *piVar5;
  string_t local_f0;
  string_t local_d0;
  allocator local_a9;
  string local_a8 [32];
  ulong local_88;
  unsigned_long codepoint2;
  string local_78 [32];
  ulong local_58;
  unsigned_long codepoint;
  lexer_char_t *k;
  uchar *local_40;
  uchar *e;
  lexer_char_t *i;
  undefined1 local_19;
  lexer *local_18;
  lexer *this_local;
  string_t *result;
  
  local_18 = this;
  this_local = (lexer *)__return_storage_ptr__;
  if ((long)this->m_cursor - (long)this->m_start < 2) {
    __assert_fail("m_cursor - m_start >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                  ,0x2ae1,
                  "string_t nlohmann::basic_json<>::lexer::get_string() const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                 );
  }
  local_19 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  e = this->m_start;
  do {
    while( true ) {
      e = e + 1;
      if (this->m_cursor + -1 <= e) {
        return __return_storage_ptr__;
      }
      k._7_1_ = 0x5c;
      local_40 = std::find<unsigned_char_const*,char>(e,this->m_cursor + -1,(char *)((long)&k + 7));
      if (local_40 == e) break;
      for (codepoint = (unsigned_long)e; codepoint < local_40; codepoint = codepoint + 1) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      e = local_40 + -1;
    }
    puVar1 = e + 1;
    switch(*puVar1) {
    case '\"':
      e = puVar1;
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
      puVar1 = e;
      break;
    case '/':
      e = puVar1;
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
      puVar1 = e;
      break;
    case '\\':
      e = puVar1;
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\");
      puVar1 = e;
      break;
    case 'b':
      e = puVar1;
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\b");
      puVar1 = e;
      break;
    case 'f':
      e = puVar1;
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\f");
      puVar1 = e;
      break;
    case 'n':
      e = puVar1;
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
      puVar1 = e;
      break;
    case 'r':
      e = puVar1;
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\r");
      puVar1 = e;
      break;
    case 't':
      e = puVar1;
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\t");
      puVar1 = e;
      break;
    case 'u':
      puVar2 = e + 2;
      e = puVar1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,(char *)puVar2,4,(allocator *)((long)&codepoint2 + 7));
      pcVar3 = (char *)std::__cxx11::string::c_str();
      uVar4 = strtoul(pcVar3,(char **)0x0,0x10);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)((long)&codepoint2 + 7));
      local_58 = uVar4;
      if ((uVar4 < 0xd800) || (0xdbff < uVar4)) {
        if ((0xdbff < uVar4) && (uVar4 < 0xe000)) {
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar5,"missing high surrogate");
          __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        to_unicode(&local_f0,uVar4,0);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        puVar1 = e + 4;
      }
      else {
        if (((this->m_limit <= e + 6) || (e[5] != '\\')) || (e[6] != 'u')) {
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar5,"missing low surrogate");
          __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        puVar1 = e + 7;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a8,(char *)puVar1,4,&local_a9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        uVar4 = strtoul(pcVar3,(char **)0x0,0x10);
        std::__cxx11::string::~string(local_a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_a9);
        local_88 = uVar4;
        to_unicode(&local_d0,local_58,uVar4);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        puVar1 = e + 10;
      }
    }
    e = puVar1;
  } while( true );
}

Assistant:

string_t get_string() const
        {
            assert(m_cursor - m_start >= 2);

            string_t result;
            result.reserve(static_cast<size_t>(m_cursor - m_start - 2));

            // iterate the result between the quotes
            for (const lexer_char_t* i = m_start + 1; i < m_cursor - 1; ++i)
            {
                // find next escape character
                auto e = std::find(i, m_cursor - 1, '\\');
                if (e != i)
                {
                    // see https://github.com/nlohmann/json/issues/365#issuecomment-262874705
                    for (auto k = i; k < e; k++)
                    {
                        result.push_back(static_cast<typename string_t::value_type>(*k));
                    }
                    i = e - 1; // -1 because of ++i
                }
                else
                {
                    // processing escaped character
                    // read next character
                    ++i;

                    switch (*i)
                    {
                        // the default escapes
                        case 't':
                        {
                            result += "\t";
                            break;
                        }
                        case 'b':
                        {
                            result += "\b";
                            break;
                        }
                        case 'f':
                        {
                            result += "\f";
                            break;
                        }
                        case 'n':
                        {
                            result += "\n";
                            break;
                        }
                        case 'r':
                        {
                            result += "\r";
                            break;
                        }
                        case '\\':
                        {
                            result += "\\";
                            break;
                        }
                        case '/':
                        {
                            result += "/";
                            break;
                        }
                        case '"':
                        {
                            result += "\"";
                            break;
                        }

                        // unicode
                        case 'u':
                        {
                            // get code xxxx from uxxxx
                            auto codepoint = std::strtoul(std::string(reinterpret_cast<typename string_t::const_pointer>(i + 1),
                                                          4).c_str(), nullptr, 16);

                            // check if codepoint is a high surrogate
                            if (codepoint >= 0xD800 and codepoint <= 0xDBFF)
                            {
                                // make sure there is a subsequent unicode
                                if ((i + 6 >= m_limit) or * (i + 5) != '\\' or * (i + 6) != 'u')
                                {
                                    JSON_THROW(std::invalid_argument("missing low surrogate"));
                                }

                                // get code yyyy from uxxxx\uyyyy
                                auto codepoint2 = std::strtoul(std::string(reinterpret_cast<typename string_t::const_pointer>
                                                               (i + 7), 4).c_str(), nullptr, 16);
                                result += to_unicode(codepoint, codepoint2);
                                // skip the next 10 characters (xxxx\uyyyy)
                                i += 10;
                            }
                            else if (codepoint >= 0xDC00 and codepoint <= 0xDFFF)
                            {
                                // we found a lone low surrogate
                                JSON_THROW(std::invalid_argument("missing high surrogate"));
                            }
                            else
                            {
                                // add unicode character(s)
                                result += to_unicode(codepoint);
                                // skip the next four characters (xxxx)
                                i += 4;
                            }
                            break;
                        }
                    }
                }
            }

            return result;
        }